

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

config_value * config_value_create_number(intmax_t number)

{
  config_value *value;
  intmax_t number_local;
  
  number_local = (intmax_t)malloc(0x10);
  if ((undefined4 *)number_local == (undefined4 *)0x0) {
    number_local = 0;
  }
  else {
    *(undefined4 *)number_local = 2;
    *(intmax_t *)(number_local + 8) = number;
  }
  return (config_value *)number_local;
}

Assistant:

struct config_value *config_value_create_number(intmax_t number)
{
        struct config_value *value = malloc(sizeof(struct config_value));

        if (value == NULL) {
                return NULL;
        }

        value->type = NUMBER;
        value->data.number = number;

        return value;
}